

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::_::ArrayJoinPromiseNodeBase::Branch> * __thiscall
kj::Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::operator=
          (Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this,
          Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *other)

{
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *other_local;
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (Branch *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }